

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O2

void Simulator::updateSimSpeed(SimSpeed newSpeed)

{
  UserInterface *pUVar1;
  Uint8 blue;
  Uint8 green;
  Shape *this;
  Uint8 red;
  Simulator *in_RSI;
  locale alStack_78 [8];
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_70
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  pUVar1 = userInterfacePtr;
  simSpeed = newSpeed;
  switch(newSpeed) {
  case Paused:
    std::locale::locale((locale *)&local_50);
    sf::String::String((String *)&local_70," Current TPS limit: Paused    ",(locale *)&local_50);
    sf::Text::setString(&(pUVar1->tpsDisplay).text,(String *)&local_70);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string(&local_70);
    std::locale::~locale((locale *)&local_50);
    green = '\n';
    break;
  case Slow:
    decimalToString_abi_cxx11_(&local_30,in_RSI,config.slowTPSLimit);
    std::operator+(&local_50," Current TPS limit: ",&local_30);
    std::locale::locale(alStack_78);
    sf::String::String((String *)&local_70,&local_50,alStack_78);
    sf::Text::setString(&(pUVar1->tpsDisplay).text,(String *)&local_70);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string(&local_70);
    std::locale::~locale(alStack_78);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    green = 0xe6;
    break;
  case Medium:
    decimalToString_abi_cxx11_(&local_30,in_RSI,config.mediumTPSLimit);
    std::operator+(&local_50," Current TPS limit: ",&local_30);
    std::locale::locale(alStack_78);
    sf::String::String((String *)&local_70,&local_50,alStack_78);
    sf::Text::setString(&(pUVar1->tpsDisplay).text,(String *)&local_70);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string(&local_70);
    std::locale::~locale(alStack_78);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    red = '\n';
    goto LAB_00125064;
  case Fast:
    decimalToString_abi_cxx11_(&local_30,in_RSI,config.fastTPSLimit);
    std::operator+(&local_50," Current TPS limit: ",&local_30);
    std::locale::locale(alStack_78);
    sf::String::String((String *)&local_70,&local_50,alStack_78);
    sf::Text::setString(&(pUVar1->tpsDisplay).text,(String *)&local_70);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string(&local_70);
    std::locale::~locale(alStack_78);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    red = 0xe6;
LAB_00125064:
    blue = '\n';
    this = &(userInterfacePtr->tpsDisplay).button.super_Shape;
    green = 0xe6;
    goto LAB_00125178;
  default:
    std::locale::locale((locale *)&local_50);
    sf::String::String((String *)&local_70," Current TPS limit: Unlimited ",(locale *)&local_50);
    sf::Text::setString(&(pUVar1->tpsDisplay).text,(String *)&local_70);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string(&local_70);
    std::locale::~locale((locale *)&local_50);
    this = &(userInterfacePtr->tpsDisplay).button.super_Shape;
    blue = '\n';
    red = 0xe6;
    green = blue;
    goto LAB_00125178;
  }
  red = '\n';
  this = &(userInterfacePtr->tpsDisplay).button.super_Shape;
  blue = 0xe6;
LAB_00125178:
  sf::Color::Color((Color *)&local_70,red,green,blue,0xff);
  sf::Shape::setFillColor(this,(Color *)&local_70);
  return;
}

Assistant:

void Simulator::updateSimSpeed(SimSpeed newSpeed) {
    simSpeed = newSpeed;
    if (newSpeed == SimSpeed::Paused) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: Paused    ");
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(10, 10, 230));
    } else if (newSpeed == SimSpeed::Slow) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: " + decimalToString(config.slowTPSLimit));
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(10, 230, 230));
    } else if (newSpeed == SimSpeed::Medium) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: " + decimalToString(config.mediumTPSLimit));
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(10, 230, 10));
    } else if (newSpeed == SimSpeed::Fast) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: " + decimalToString(config.fastTPSLimit));
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(230, 230, 10));
    } else {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: Unlimited ");
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(230, 10, 10));
    }
}